

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O3

void __thiscall
deqp::gles31::Functional::anon_unknown_1::GeometryShaderRenderTest::genVertexAttribData
          (GeometryShaderRenderTest *this)

{
  pointer pVVar1;
  int i;
  ulong uVar2;
  long lVar3;
  undefined4 uVar4;
  
  lVar3 = 0xc;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_vertexPosData,0xc);
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1->m_data[0] = -0.5;
  pVVar1->m_data[1] = -0.2;
  pVVar1->m_data[2] = 0.0;
  pVVar1->m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[1].m_data[0] = -0.8;
  pVVar1[1].m_data[1] = -0.5;
  pVVar1[1].m_data[2] = 0.0;
  pVVar1[1].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[2].m_data[0] = -0.5;
  pVVar1[2].m_data[1] = -0.5;
  pVVar1[2].m_data[2] = 0.0;
  pVVar1[2].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[3].m_data[0] = -0.19999999;
  pVVar1[3].m_data[1] = 0.10000001;
  pVVar1[3].m_data[2] = 0.0;
  pVVar1[3].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[4].m_data[0] = -0.19999999;
  pVVar1[4].m_data[1] = -0.2;
  pVVar1[4].m_data[2] = 0.0;
  pVVar1[4].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[5].m_data[0] = -0.5;
  pVVar1[5].m_data[1] = -0.8;
  pVVar1[5].m_data[2] = 0.0;
  pVVar1[5].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[6].m_data[0] = -0.19999999;
  pVVar1[6].m_data[1] = -0.5;
  pVVar1[6].m_data[2] = 0.0;
  pVVar1[6].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[7].m_data[0] = 0.100000024;
  pVVar1[7].m_data[1] = 0.10000001;
  pVVar1[7].m_data[2] = 0.0;
  pVVar1[7].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[8].m_data[0] = 0.100000024;
  pVVar1[8].m_data[1] = -0.2;
  pVVar1[8].m_data[2] = 0.0;
  pVVar1[8].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[9].m_data[0] = -0.19999999;
  pVVar1[9].m_data[1] = -0.8;
  pVVar1[9].m_data[2] = 0.0;
  pVVar1[9].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[10].m_data[0] = 0.100000024;
  pVVar1[10].m_data[1] = -0.5;
  pVVar1[10].m_data[2] = 0.0;
  pVVar1[10].m_data[3] = 1.0;
  pVVar1 = (this->m_vertexPosData).
           super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar1[0xb].m_data[0] = 0.40000004;
  pVVar1[0xb].m_data[1] = -0.2;
  pVVar1[0xb].m_data[2] = 0.0;
  pVVar1[0xb].m_data[3] = 1.0;
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
            (&this->m_vertexAttrData,0xc);
  uVar2 = 0;
  do {
    uVar4 = 0x3f800000;
    if ((uVar2 & 1) != 0) {
      uVar4 = 0;
    }
    pVVar1 = (this->m_vertexAttrData).
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(undefined4 *)((long)pVVar1->m_data + lVar3 + -0xc) = 0x3f800000;
    *(undefined4 *)((long)pVVar1->m_data + lVar3 + -8) = uVar4;
    *(undefined4 *)((long)pVVar1->m_data + lVar3 + -4) = uVar4;
    *(undefined4 *)((long)pVVar1->m_data + lVar3) = 0x3f800000;
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 0x10;
  } while (uVar2 != 0xc);
  this->m_numDrawVertices = 0xc;
  return;
}

Assistant:

void GeometryShaderRenderTest::genVertexAttribData (void)
{
	// Create 1 X 2 grid in triangle strip adjacent - order
	const float scale = 0.3f;
	const tcu::Vec4 offset(-0.5f, -0.2f, 0.0f, 1.0f);

	m_vertexPosData.resize(12);
	m_vertexPosData[ 0] = tcu::Vec4( 0,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 1] = tcu::Vec4(-1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 2] = tcu::Vec4( 0, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 3] = tcu::Vec4( 1,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 4] = tcu::Vec4( 1,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 5] = tcu::Vec4( 0, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 6] = tcu::Vec4( 1, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 7] = tcu::Vec4( 2,  1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 8] = tcu::Vec4( 2,  0, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[ 9] = tcu::Vec4( 1, -2, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[10] = tcu::Vec4( 2, -1, 0.0f, 0.0f) * scale + offset;
	m_vertexPosData[11] = tcu::Vec4( 3,  0, 0.0f, 0.0f) * scale + offset;

	// Red and white
	m_vertexAttrData.resize(12);
	for (int i = 0; i < 12; ++i)
		m_vertexAttrData[i] = (i % 2 == 0) ? tcu::Vec4(1, 1, 1, 1) : tcu::Vec4(1, 0, 0, 1);

	m_numDrawVertices = 12;
}